

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O0

void __thiscall
burst::subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::subsequence_iterator
          (subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           *this,char *first,char *last)

{
  size_type __n;
  allocator<const_char_*> local_21;
  char *local_20;
  char *last_local;
  char *first_local;
  subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  *this_local;
  
  this->m_begin = first;
  this->m_end = last;
  local_20 = last;
  last_local = first;
  first_local = (char *)this;
  __n = std::distance<char_const*>(this->m_begin,this->m_end);
  std::allocator<const_char_*>::allocator(&local_21);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->m_subsequence,__n,&local_21);
  std::allocator<const_char_*>::~allocator(&local_21);
  this->m_subsequence_size = 0;
  increment(this);
  return;
}

Assistant:

subsequence_iterator (ForwardIterator first, ForwardIterator last):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subsequence(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subsequence_size(0)
        {
            increment();
        }